

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O3

void duckdb::BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::InsertByteInternal
               (BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *n,uint8_t byte)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  byte bVar7;
  
  bVar1 = n->count;
  uVar2 = (ulong)bVar1;
  uVar3 = 0;
  uVar4 = uVar3;
  if (uVar2 != 0) {
    do {
      if (byte <= n->key[uVar3]) {
        uVar4 = uVar3;
        if ((byte)uVar3 < bVar1) {
          uVar5 = uVar2 + 0xffffffff;
          puVar6 = n->key + uVar2;
          do {
            *puVar6 = n->key[uVar5 & 0xffffffff];
            uVar5 = uVar5 - 1;
            puVar6 = (uint8_t *)((long)puVar6 + 0xffffffffffffffff);
            bVar7 = (char)uVar2 - 1;
            uVar2 = (ulong)bVar7;
          } while ((byte)uVar3 < bVar7);
        }
        break;
      }
      uVar3 = uVar3 + 1;
      uVar4 = uVar2;
    } while (uVar2 != uVar3);
  }
  n->key[uVar4 & 0xff] = byte;
  n->count = bVar1 + 1;
  return;
}

Assistant:

void BaseLeaf<CAPACITY, TYPE>::InsertByteInternal(BaseLeaf &n, const uint8_t byte) {
	// Still space. Insert the child.
	uint8_t child_pos = 0;
	while (child_pos < n.count && n.key[child_pos] < byte) {
		child_pos++;
	}

	// Move children backwards to make space.
	for (uint8_t i = n.count; i > child_pos; i--) {
		n.key[i] = n.key[i - 1];
	}

	n.key[child_pos] = byte;
	n.count++;
}